

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

sqlite3_pcache * pcache1Create(int szPage,int szExtra,int bPurgeable)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  sqlite3_pcache *psVar4;
  sqlite3_mutex *psVar5;
  PCacheGlobal *pPVar6;
  
  iVar1 = sqlite3Config.bCoreMutex;
  iVar2 = 0x38;
  if (0 < sqlite3Config.bCoreMutex) {
    iVar2 = 0x60;
  }
  psVar4 = (sqlite3_pcache *)sqlite3MallocZero(iVar2);
  if (psVar4 != (sqlite3_pcache *)0x0) {
    if (iVar1 < 1) {
      pPVar6 = &pcache1_g;
    }
    else {
      pPVar6 = (PCacheGlobal *)(psVar4 + 0x38);
      *(undefined4 *)(psVar4 + 0x48) = 10;
    }
    *(PCacheGlobal **)psVar4 = pPVar6;
    *(int *)(psVar4 + 8) = szPage;
    *(int *)(psVar4 + 0xc) = szExtra;
    *(uint *)(psVar4 + 0x10) = (uint)(bPurgeable != 0);
    if (bPurgeable != 0) {
      *(undefined4 *)(psVar4 + 0x14) = 10;
      psVar5 = (pPVar6->grp).mutex;
      if (psVar5 == (sqlite3_mutex *)0x0) {
        iVar2 = 10;
        psVar5 = (sqlite3_mutex *)0x0;
      }
      else {
        (*sqlite3Config.mutex.xMutexEnter)(psVar5);
        iVar2 = *(int *)(psVar4 + 0x14);
        psVar5 = (pPVar6->grp).mutex;
      }
      uVar3 = iVar2 + (pPVar6->grp).nMinPage;
      (pPVar6->grp).nMinPage = uVar3;
      (pPVar6->grp).mxPinned = ((pPVar6->grp).nMaxPage - uVar3) + 10;
      if (psVar5 != (sqlite3_mutex *)0x0) {
        (*sqlite3Config.mutex.xMutexLeave)(psVar5);
      }
    }
  }
  return psVar4;
}

Assistant:

static sqlite3_pcache *pcache1Create(int szPage, int szExtra, int bPurgeable){
  PCache1 *pCache;      /* The newly created page cache */
  PGroup *pGroup;       /* The group the new page cache will belong to */
  int sz;               /* Bytes of memory required to allocate the new cache */

  /*
  ** The seperateCache variable is true if each PCache has its own private
  ** PGroup.  In other words, separateCache is true for mode (1) where no
  ** mutexing is required.
  **
  **   *  Always use a unified cache (mode-2) if ENABLE_MEMORY_MANAGEMENT
  **
  **   *  Always use a unified cache in single-threaded applications
  **
  **   *  Otherwise (if multi-threaded and ENABLE_MEMORY_MANAGEMENT is off)
  **      use separate caches (mode-1)
  */
#if defined(SQLITE_ENABLE_MEMORY_MANAGEMENT) || SQLITE_THREADSAFE==0
  const int separateCache = 0;
#else
  int separateCache = sqlite3GlobalConfig.bCoreMutex>0;
#endif

  assert( (szPage & (szPage-1))==0 && szPage>=512 && szPage<=65536 );
  assert( szExtra < 300 );

  sz = sizeof(PCache1) + sizeof(PGroup)*separateCache;
  pCache = (PCache1 *)sqlite3MallocZero(sz);
  if( pCache ){
    if( separateCache ){
      pGroup = (PGroup*)&pCache[1];
      pGroup->mxPinned = 10;
    }else{
      pGroup = &pcache1.grp;
    }
    pCache->pGroup = pGroup;
    pCache->szPage = szPage;
    pCache->szExtra = szExtra;
    pCache->bPurgeable = (bPurgeable ? 1 : 0);
    if( bPurgeable ){
      pCache->nMin = 10;
      pcache1EnterMutex(pGroup);
      pGroup->nMinPage += pCache->nMin;
      pGroup->mxPinned = pGroup->nMaxPage + 10 - pGroup->nMinPage;
      pcache1LeaveMutex(pGroup);
    }
  }
  return (sqlite3_pcache *)pCache;
}